

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_engines.cc
# Opt level: O1

tuple<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
* generate_list<trng::mt19937_64>
            (tuple<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
             *__return_storage_ptr__,mt19937_64 *r1,mt19937_64 *r2,long N,long skip1,long skip2)

{
  _Tuple_impl<0ul,std::vector<unsigned_long,std::allocator<unsigned_long>>,std::vector<unsigned_long,std::allocator<unsigned_long>>>
  *p_Var1;
  long lVar2;
  long lVar3;
  uint uVar4;
  int iVar5;
  vector<unsigned_long,_std::allocator<unsigned_long>_> v2;
  vector<unsigned_long,_std::allocator<unsigned_long>_> v1;
  ulong local_90;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_88;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_68;
  long local_48;
  _Tuple_impl<0ul,std::vector<unsigned_long,std::allocator<unsigned_long>>,std::vector<unsigned_long,std::allocator<unsigned_long>>>
  *local_40;
  long local_38;
  
  local_68.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (unsigned_long *)0x0;
  local_68.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (unsigned_long *)0x0;
  local_88.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (unsigned_long *)0x0;
  local_88.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_88.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (unsigned_long *)0x0;
  local_40 = (_Tuple_impl<0ul,std::vector<unsigned_long,std::allocator<unsigned_long>>,std::vector<unsigned_long,std::allocator<unsigned_long>>>
              *)__return_storage_ptr__;
  local_38 = N;
  if (0 < N) {
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve(&local_68,N);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve(&local_88,N);
    lVar3 = 0;
    do {
      if (0x137 < (r1->S).mti) {
        lVar2 = -0x9c;
        do {
          uVar4 = (uint)(r1->S).mt[lVar2 + 0x9d];
          (r1->S).mt[lVar2 + 0x9c] =
               *(ulong *)(&DAT_002a82a0 + (ulong)(uVar4 & 1) * 8) ^ r1[1].S.mt[lVar2 + -2] ^
               ((ulong)(uVar4 & 0x7ffffffe) | (r1->S).mt[lVar2 + 0x9c] & 0xffffffff80000000) >> 1;
          lVar2 = lVar2 + 1;
        } while (lVar2 != 0);
        lVar2 = 0;
        do {
          uVar4 = (uint)(r1->S).mt[lVar2 + 0x9d];
          (r1->S).mt[lVar2 + 0x9c] =
               *(ulong *)(&DAT_002a82a0 + (ulong)(uVar4 & 1) * 8) ^ (r1->S).mt[lVar2] ^
               ((ulong)(uVar4 & 0x7ffffffe) | (r1->S).mt[lVar2 + 0x9c] & 0xffffffff80000000) >> 1;
          lVar2 = lVar2 + 1;
        } while (lVar2 != 0x9b);
        uVar4 = (uint)(r1->S).mt[0];
        (r1->S).mt[0x137] =
             *(ulong *)(&DAT_002a82a0 + (ulong)(uVar4 & 1) * 8) ^ (r1->S).mt[0x9b] ^
             ((ulong)(uVar4 & 0x7ffffffe) | (r1->S).mt[0x137] & 0xffffffff80000000) >> 1;
        (r1->S).mti = 0;
      }
      iVar5 = (r1->S).mti;
      (r1->S).mti = iVar5 + 1;
      local_90 = (r1->S).mt[iVar5];
      local_90 = local_90 >> 0x1d & 0x555555555 ^ local_90;
      local_90 = (local_90 & 0x38eb3ffff6d3) << 0x11 ^ local_90;
      local_90 = (local_90 & 0x7ffbf77) << 0x25 ^ local_90;
      local_90 = local_90 >> 0x2b ^ local_90;
      local_48 = lVar3;
      if (local_68.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_68.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_realloc_insert<unsigned_long>
                  (&local_68,
                   (iterator)
                   local_68.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_finish,&local_90);
      }
      else {
        *local_68.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
         super__Vector_impl_data._M_finish = local_90;
        local_68.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_68.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish + 1;
      }
      if (0x137 < (r2->S).mti) {
        lVar3 = -0x9c;
        do {
          uVar4 = (uint)(r2->S).mt[lVar3 + 0x9d];
          (r2->S).mt[lVar3 + 0x9c] =
               *(ulong *)(&DAT_002a82a0 + (ulong)(uVar4 & 1) * 8) ^ r2[1].S.mt[lVar3 + -2] ^
               ((ulong)(uVar4 & 0x7ffffffe) | (r2->S).mt[lVar3 + 0x9c] & 0xffffffff80000000) >> 1;
          lVar3 = lVar3 + 1;
        } while (lVar3 != 0);
        lVar3 = 0;
        do {
          uVar4 = (uint)(r2->S).mt[lVar3 + 0x9d];
          (r2->S).mt[lVar3 + 0x9c] =
               *(ulong *)(&DAT_002a82a0 + (ulong)(uVar4 & 1) * 8) ^ (r2->S).mt[lVar3] ^
               ((ulong)(uVar4 & 0x7ffffffe) | (r2->S).mt[lVar3 + 0x9c] & 0xffffffff80000000) >> 1;
          lVar3 = lVar3 + 1;
        } while (lVar3 != 0x9b);
        uVar4 = (uint)(r2->S).mt[0];
        (r2->S).mt[0x137] =
             *(ulong *)(&DAT_002a82a0 + (ulong)(uVar4 & 1) * 8) ^ (r2->S).mt[0x9b] ^
             ((ulong)(uVar4 & 0x7ffffffe) | (r2->S).mt[0x137] & 0xffffffff80000000) >> 1;
        (r2->S).mti = 0;
      }
      iVar5 = (r2->S).mti;
      (r2->S).mti = iVar5 + 1;
      local_90 = (r2->S).mt[iVar5];
      local_90 = local_90 >> 0x1d & 0x555555555 ^ local_90;
      local_90 = (local_90 & 0x38eb3ffff6d3) << 0x11 ^ local_90;
      local_90 = (local_90 & 0x7ffbf77) << 0x25 ^ local_90;
      local_90 = local_90 >> 0x2b ^ local_90;
      if (local_88.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_88.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_realloc_insert<unsigned_long>
                  (&local_88,
                   (iterator)
                   local_88.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_finish,&local_90);
      }
      else {
        *local_88.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
         super__Vector_impl_data._M_finish = local_90;
        local_88.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_88.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish + 1;
      }
      if (0 < skip1) {
        iVar5 = (r1->S).mti;
        lVar3 = 0;
        do {
          if (0x137 < iVar5) {
            lVar2 = -0x9c;
            do {
              uVar4 = (uint)(r1->S).mt[lVar2 + 0x9d];
              (r1->S).mt[lVar2 + 0x9c] =
                   *(ulong *)(&DAT_002a82a0 + (ulong)(uVar4 & 1) * 8) ^ r1[1].S.mt[lVar2 + -2] ^
                   ((ulong)(uVar4 & 0x7ffffffe) | (r1->S).mt[lVar2 + 0x9c] & 0xffffffff80000000) >>
                   1;
              lVar2 = lVar2 + 1;
            } while (lVar2 != 0);
            lVar2 = 0;
            do {
              uVar4 = (uint)(r1->S).mt[lVar2 + 0x9d];
              (r1->S).mt[lVar2 + 0x9c] =
                   *(ulong *)(&DAT_002a82a0 + (ulong)(uVar4 & 1) * 8) ^ (r1->S).mt[lVar2] ^
                   ((ulong)(uVar4 & 0x7ffffffe) | (r1->S).mt[lVar2 + 0x9c] & 0xffffffff80000000) >>
                   1;
              lVar2 = lVar2 + 1;
            } while (lVar2 != 0x9b);
            uVar4 = (uint)(r1->S).mt[0];
            (r1->S).mt[0x137] =
                 *(ulong *)(&DAT_002a82a0 + (ulong)(uVar4 & 1) * 8) ^ (r1->S).mt[0x9b] ^
                 ((ulong)(uVar4 & 0x7ffffffe) | (r1->S).mt[0x137] & 0xffffffff80000000) >> 1;
            iVar5 = 0;
          }
          iVar5 = iVar5 + 1;
          lVar3 = lVar3 + 1;
        } while (lVar3 != skip1);
        (r1->S).mti = iVar5;
      }
      if (0 < skip2) {
        iVar5 = (r2->S).mti;
        lVar3 = 0;
        do {
          if (0x137 < iVar5) {
            lVar2 = -0x9c;
            do {
              uVar4 = (uint)(r2->S).mt[lVar2 + 0x9d];
              (r2->S).mt[lVar2 + 0x9c] =
                   *(ulong *)(&DAT_002a82a0 + (ulong)(uVar4 & 1) * 8) ^ r2[1].S.mt[lVar2 + -2] ^
                   ((ulong)(uVar4 & 0x7ffffffe) | (r2->S).mt[lVar2 + 0x9c] & 0xffffffff80000000) >>
                   1;
              lVar2 = lVar2 + 1;
            } while (lVar2 != 0);
            lVar2 = 0;
            do {
              uVar4 = (uint)(r2->S).mt[lVar2 + 0x9d];
              (r2->S).mt[lVar2 + 0x9c] =
                   *(ulong *)(&DAT_002a82a0 + (ulong)(uVar4 & 1) * 8) ^ (r2->S).mt[lVar2] ^
                   ((ulong)(uVar4 & 0x7ffffffe) | (r2->S).mt[lVar2 + 0x9c] & 0xffffffff80000000) >>
                   1;
              lVar2 = lVar2 + 1;
            } while (lVar2 != 0x9b);
            uVar4 = (uint)(r2->S).mt[0];
            (r2->S).mt[0x137] =
                 *(ulong *)(&DAT_002a82a0 + (ulong)(uVar4 & 1) * 8) ^ (r2->S).mt[0x9b] ^
                 ((ulong)(uVar4 & 0x7ffffffe) | (r2->S).mt[0x137] & 0xffffffff80000000) >> 1;
            iVar5 = 0;
          }
          iVar5 = iVar5 + 1;
          lVar3 = lVar3 + 1;
        } while (lVar3 != skip2);
        (r2->S).mti = iVar5;
      }
      lVar3 = local_48 + 1;
    } while (lVar3 != local_38);
  }
  p_Var1 = local_40;
  std::
  _Tuple_impl<0ul,std::vector<unsigned_long,std::allocator<unsigned_long>>,std::vector<unsigned_long,std::allocator<unsigned_long>>>
  ::
  _Tuple_impl<std::vector<unsigned_long,std::allocator<unsigned_long>>&,std::vector<unsigned_long,std::allocator<unsigned_long>>&,void>
            (local_40,&local_68,&local_88);
  if (local_88.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_88.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_68.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_68.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  return (tuple<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
          *)p_Var1;
}

Assistant:

std::tuple<std::vector<typename R::result_type>, std::vector<typename R::result_type>>
generate_list(R &r1, R &r2, const long N, const long skip1, const long skip2) {
  std::vector<typename R::result_type> v1, v2;
  if (N > 0) {
    v1.reserve(N);
    v2.reserve(N);
  }
  for (long i{0}; i < N; ++i) {
    v1.push_back(r1());
    v2.push_back(r2());
    for (long j{0}; j < skip1; ++j)
      r1();
    for (long j{0}; j < skip2; ++j)
      r2();
  }
  return {v1, v2};
}